

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O1

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minAbsRowscale(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *__return_storage_ptr__,
                SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int __exponent;
  double a;
  
  lVar2 = (long)this->m_activeRowscaleExp->thesize;
  if (lVar2 < 1) {
    __exponent = 0x7fffffff;
  }
  else {
    __exponent = 0x7fffffff;
    lVar3 = 0;
    do {
      iVar1 = this->m_activeRowscaleExp->data[lVar3];
      if (iVar1 < __exponent) {
        __exponent = iVar1;
      }
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  a = ldexp(1.0,__exponent);
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 10;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x25) = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)__return_storage_ptr__,a);
  return __return_storage_ptr__;
}

Assistant:

R SPxScaler<R>::minAbsRowscale() const
{
   const DataArray < int >& rowscaleExp = *m_activeRowscaleExp;

   int mini = std::numeric_limits<int>::max();

   for(int i = 0; i < rowscaleExp.size(); ++i)
      if(rowscaleExp[i] < mini)
         mini = rowscaleExp[i];

   return spxLdexp(1.0, mini);
}